

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O2

void __thiscall embree::SubdivMesh::setVertexAttributeCount(SubdivMesh *this,uint N)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  RawBufferView *pRVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  RawBufferView *pRVar10;
  size_t i;
  long lVar11;
  ulong uVar12;
  ulong __new_size;
  ulong __n;
  
  __new_size = (ulong)N;
  uVar12 = (this->vertexAttribs).size_alloced;
  __n = uVar12;
  if ((uVar12 < __new_size) && (uVar9 = uVar12, __n = __new_size, uVar12 != 0)) {
    for (; __n = uVar9, uVar9 < __new_size; uVar9 = uVar9 * 2 + (ulong)(uVar9 * 2 == 0)) {
    }
  }
  uVar9 = (this->vertexAttribs).size_active;
  if (__new_size < uVar9) {
    lVar11 = __new_size * 0x38;
    for (uVar12 = __new_size; uVar12 < uVar9; uVar12 = uVar12 + 1) {
      RawBufferView::~RawBufferView
                ((RawBufferView *)((long)&((this->vertexAttribs).items)->ptr_ofs + lVar11));
      uVar9 = (this->vertexAttribs).size_active;
      lVar11 = lVar11 + 0x38;
    }
    (this->vertexAttribs).size_active = __new_size;
    uVar12 = (this->vertexAttribs).size_alloced;
    uVar9 = __new_size;
  }
  if (uVar12 == __n) {
    lVar11 = uVar9 * 0x38 + 0x30;
    for (; uVar9 < __new_size; uVar9 = uVar9 + 1) {
      pRVar3 = (this->vertexAttribs).items;
      puVar1 = (undefined8 *)((long)pRVar3 + lVar11 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pRVar3 + lVar11 + -0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pRVar3 + lVar11 + -0x10) = 0x100000000;
      *(undefined1 *)((long)pRVar3 + lVar11 + -8) = 1;
      *(undefined4 *)((long)pRVar3 + lVar11 + -4) = 0;
      *(undefined8 *)((long)&pRVar3->ptr_ofs + lVar11) = 0;
      lVar11 = lVar11 + 0x38;
    }
    (this->vertexAttribs).size_active = __new_size;
  }
  else {
    pRVar3 = (this->vertexAttribs).items;
    lVar11 = 0;
    pRVar10 = __gnu_cxx::new_allocator<embree::RawBufferView>::allocate
                        ((new_allocator<embree::RawBufferView> *)&this->vertexAttribs,__n,
                         (void *)0x0);
    (this->vertexAttribs).items = pRVar10;
    for (uVar12 = 0; uVar9 = (this->vertexAttribs).size_active, uVar12 < uVar9; uVar12 = uVar12 + 1)
    {
      pRVar10 = (this->vertexAttribs).items;
      puVar1 = (undefined8 *)((long)&pRVar3->ptr_ofs + lVar11);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pRVar3->stride + lVar11);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pRVar3->format + lVar11);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pRVar10->format + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      puVar1 = (undefined8 *)((long)&pRVar10->stride + lVar11);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1 = (undefined8 *)((long)&pRVar10->ptr_ofs + lVar11);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      *(undefined8 *)((long)&(pRVar10->buffer).ptr + lVar11) =
           *(undefined8 *)((long)&(pRVar3->buffer).ptr + lVar11);
      *(undefined8 *)((long)&(pRVar3->buffer).ptr + lVar11) = 0;
      RawBufferView::~RawBufferView((RawBufferView *)((long)&pRVar3->ptr_ofs + lVar11));
      lVar11 = lVar11 + 0x38;
    }
    lVar11 = uVar9 * 0x38 + 0x30;
    for (; uVar9 < __new_size; uVar9 = uVar9 + 1) {
      pRVar10 = (this->vertexAttribs).items;
      puVar1 = (undefined8 *)((long)pRVar10 + lVar11 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pRVar10 + lVar11 + -0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pRVar10 + lVar11 + -0x10) = 0x100000000;
      *(undefined1 *)((long)pRVar10 + lVar11 + -8) = 1;
      *(undefined4 *)((long)pRVar10 + lVar11 + -4) = 0;
      *(undefined8 *)((long)&pRVar10->ptr_ofs + lVar11) = 0;
      lVar11 = lVar11 + 0x38;
    }
    ::operator_delete(pRVar3);
    (this->vertexAttribs).size_active = __new_size;
    (this->vertexAttribs).size_alloced = __n;
  }
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::resize(&this->vertex_attrib_buffer_tags,__new_size);
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void SubdivMesh::setVertexAttributeCount (unsigned int N)
  {
    vertexAttribs.resize(N);
    vertex_attrib_buffer_tags.resize(N);
    Geometry::update();
  }